

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

int getNum(char *str,uintptr_t *val,int8_t *opt)

{
  int iVar1;
  int iVar2;
  int8_t iVar3;
  int n;
  intmax_t v;
  
  *opt = '\0';
  iVar1 = __isoc99_sscanf(str," %ji %n",&v,&n);
  if (iVar1 == 1) {
    *val = v;
    *opt = '\x01';
    iVar1 = n;
  }
  else {
    iVar1 = __isoc99_sscanf(str," v%ji %n",&v,&n);
    if (iVar1 == 1) {
      *val = v;
      *opt = (v < 0x96) * '\x04' + -2;
      iVar1 = n;
    }
    else {
      iVar2 = __isoc99_sscanf(str," p%ji %n",&v,&n);
      iVar1 = 0;
      if (iVar2 == 1) {
        *val = v;
        iVar3 = -3;
        if (v < 10) {
          iVar3 = '\x03';
        }
        *opt = iVar3;
        iVar1 = n;
      }
    }
  }
  return iVar1;
}

Assistant:

static int getNum(char *str, uintptr_t *val, int8_t *opt)
{
   int f, n;
   intmax_t v;

   *opt = 0;

   f = sscanf(str, " %ji %n", &v, &n);

   if (f == 1)
   {
      *val = v;
      *opt = CMD_NUMERIC;
      return n;
   }

   f = sscanf(str, " v%ji %n", &v, &n);

   if (f == 1)
   {
      *val = v;
      if (v < PI_MAX_SCRIPT_VARS) *opt = CMD_VAR;
      else *opt = -CMD_VAR;
      return n;
   }

   f = sscanf(str, " p%ji %n", &v, &n);

   if (f == 1)
   {
      *val = v;
      if (v < PI_MAX_SCRIPT_PARAMS) *opt = CMD_PAR;
      else *opt = -CMD_PAR;
      return n;
   }

   return 0;
}